

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O2

int prefix_evex(pt_ild *ild,uint8_t length,uint8_t rex)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  
  if (ild == (pt_ild *)0x0) {
    iVar3 = -1;
  }
  else {
    bVar1 = ild->max_bytes;
    iVar3 = -0xe;
    if ((uint)((ulong)length + 1) < (uint)bVar1) {
      bVar2 = ild->itext[(ulong)length + 1];
      if ((ild->mode != ptem_64bit) && (bVar2 < 0xc0)) {
        iVar3 = opcode_dec(ild,length);
        return iVar3;
      }
      if (length + 5 < (uint)bVar1 || length + 5 == (uint)bVar1) {
        bVar1 = ild->itext[(byte)(length + 2)];
        ild->vex = '\x02';
        *(ushort *)&ild->field_0x10 =
             ((ushort)*(undefined4 *)&ild->field_0x10 & 0xfc7f |
             (ushort)((~(uint)bVar2 >> 3 & 2 | (uint)(-1 < (char)bVar2)) << 7)) +
             (bVar1 & 0xff80) * 4;
        resolve_vex_pp(ild,bVar1 & 3);
        ild->map = bVar2 & 7;
        iVar3 = prefix_vex_done(ild,length + '\x04');
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

static int prefix_evex(struct pt_ild *ild, uint8_t length, uint8_t rex)
{
	uint8_t max_bytes;
	uint8_t p1, p2, map;

	(void) rex;

	if (!ild)
		return -pte_internal;

	max_bytes = ild->max_bytes;

	/* Read the next byte to validate that this is indeed EVEX. */
	if (max_bytes <= (length + 1))
		return -pte_bad_insn;

	p1 = get_byte(ild, length + 1);

	/* If p1[7:6] is not 11b in non-64-bit mode, this is BOUND, not EVEX. */
	if (!mode_64b(ild) && !bits_match(p1, 0xc0, 0xc0))
		return opcode_dec(ild, length);

	/* We need at least 5 bytes
	 * - 4 for the EVEX prefix and payload and
	 * - 1 for the opcode.
	 */
	if (max_bytes < (length + 5))
		return -pte_bad_insn;

	p2 = get_byte(ild, length + 2);

	ild->vex = 2;
	ild->rex_r = ((~p1 >> 7) & 0x01) | ((~p1 >> 3) & 0x02);
	ild->rex_w = (p2 >> 7) & 0x01;

	resolve_vex_pp(ild, p2 & 0x03);

	ild->map = map = p1 & 0x07;

	/* Eat the EVEX. */
	length += 4;
	return prefix_vex_done(ild, length);
}